

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmain.cc
# Opt level: O1

int main(int argc,char **argv)

{
  Api AVar1;
  size_type sVar2;
  pointer __nptr;
  int iVar3;
  size_t sVar4;
  undefined8 *puVar5;
  int *piVar6;
  undefined8 uVar7;
  Api *pAVar8;
  pointer *ppAVar9;
  char *pcVar10;
  size_t i;
  long lVar11;
  char **ppcVar12;
  bool bVar13;
  bool bVar14;
  double dVar15;
  allocator local_81;
  undefined8 local_80;
  vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> local_78;
  undefined8 uStack_60;
  double local_58;
  Api *local_50 [2];
  Api local_40 [4];
  
  setlocale(6,(char *)"");
  lVar11 = 0;
  do {
    pcVar10 = "/usr/local/share/locale/";
    bindtextdomain(*(undefined8 *)((long)&PTR_anon_var_dwarf_5213_0021cd40 + lVar11));
    lVar11 = lVar11 + 8;
  } while (lVar11 != 0x20);
  textdomain("adljack");
  Midi_Db::init(&midi_db,(EVP_PKEY_CTX *)pcVar10);
  pcVar10 = getenv("HOME");
  if (pcVar10 != (char *)0x0) {
    local_50[0] = local_40;
    sVar4 = strlen(pcVar10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar10,pcVar10 + sVar4);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
    ppAVar9 = &local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    pAVar8 = (Api *)(puVar5 + 2);
    if ((pointer *)*puVar5 == (pointer *)pAVar8) {
      local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)pAVar8;
      uStack_60 = puVar5[3];
      local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppAVar9;
    }
    else {
      local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)pAVar8;
      local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*puVar5;
    }
    local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)puVar5[1];
    *puVar5 = pAVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&arg_config_file_abi_cxx11_,(string *)&local_78);
    if ((pointer *)
        local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
        super__Vector_impl_data._M_start != ppAVar9) {
      operator_delete(local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  iVar3 = generic_getopt(argc,argv,"L:A:M:C",usage);
  bVar13 = iVar3 == -1;
  if (bVar13) {
    local_80 = 0;
  }
  else {
    local_80 = 0;
    do {
      pcVar10 = _optarg;
      sVar2 = arg_config_file_abi_cxx11_._M_string_length;
      if (iVar3 < 0x4c) {
        if (iVar3 == 0x41) {
          ppcVar12 = audio_api_ids;
          lVar11 = 0;
          do {
            iVar3 = strcmp(pcVar10,*ppcVar12);
            if (iVar3 == 0) goto LAB_0011765f;
            lVar11 = lVar11 + 1;
            ppcVar12 = ppcVar12 + 1;
          } while (lVar11 != 10);
          lVar11 = 0;
LAB_0011765f:
          local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
          super__Vector_impl_data._M_finish = (Api *)0x0;
          local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          arg_audio_api = (Api)lVar11;
          RtAudio::getCompiledApi(&local_78);
          bVar14 = local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                   super__Vector_impl_data._M_start !=
                   local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (bVar14) {
            AVar1 = *local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            ppAVar9 = (pointer *)
                      local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            while (AVar1 != (Api)lVar11) {
              ppAVar9 = (pointer *)((long)ppAVar9 + 4);
              bVar14 = ppAVar9 !=
                       (pointer *)
                       local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              if (ppAVar9 ==
                  (pointer *)
                  local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                  super__Vector_impl_data._M_finish) break;
              AVar1 = *(Api *)ppAVar9;
            }
          }
          if ((pointer *)
              local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer *)0x0) {
            operator_delete(local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (!bVar14) {
            main_cold_2();
LAB_001177a0:
            local_80 = 1;
          }
LAB_001176c7:
          if (!bVar14) break;
        }
        else {
          if (iVar3 != 0x43) {
LAB_00117825:
            usage();
            local_80 = 1;
            break;
          }
          strlen(_optarg);
          std::__cxx11::string::_M_replace(0x2233d8,0,(char *)sVar2,(ulong)pcVar10);
        }
      }
      else {
        if (iVar3 != 0x4c) {
          if (iVar3 != 0x4d) goto LAB_00117825;
          ppcVar12 = midi_api_ids;
          lVar11 = 0;
          do {
            iVar3 = strcmp(pcVar10,*ppcVar12);
            if (iVar3 == 0) goto LAB_001175b9;
            lVar11 = lVar11 + 1;
            ppcVar12 = ppcVar12 + 1;
          } while (lVar11 != 9);
          lVar11 = 0;
LAB_001175b9:
          local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
          super__Vector_impl_data._M_finish = (Api *)0x0;
          local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          arg_midi_api = (Api)lVar11;
          RtMidi::getCompiledApi((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)&local_78);
          bVar14 = local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                   super__Vector_impl_data._M_start !=
                   local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (bVar14) {
            AVar1 = *local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            ppAVar9 = (pointer *)
                      local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            while (AVar1 != (Api)lVar11) {
              ppAVar9 = (pointer *)((long)ppAVar9 + 4);
              bVar14 = ppAVar9 !=
                       (pointer *)
                       local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              if (ppAVar9 ==
                  (pointer *)
                  local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                  super__Vector_impl_data._M_finish) break;
              AVar1 = *(Api *)ppAVar9;
            }
          }
          if ((pointer *)
              local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer *)0x0) {
            operator_delete(local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (!bVar14) {
            main_cold_1();
            goto LAB_001177a0;
          }
          goto LAB_001176c7;
        }
        std::__cxx11::string::string((string *)&local_78,_optarg,&local_81);
        __nptr = local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = __errno_location();
        iVar3 = *piVar6;
        *piVar6 = 0;
        dVar15 = strtod((char *)__nptr,(char **)local_50);
        if (local_50[0] == __nptr) {
          std::__throw_invalid_argument("stod");
LAB_00117842:
          uVar7 = std::__throw_out_of_range("stod");
          if (local_50[0] != __nptr) {
            operator_delete(local_50[0]);
          }
          _Unwind_Resume(uVar7);
        }
        if (*piVar6 == 0) {
          *piVar6 = iVar3;
        }
        else if (*piVar6 == 0x22) goto LAB_00117842;
        arg_latency = dVar15 * 0.001;
        dVar15 = arg_latency;
        if ((pointer *)
            local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          local_58 = arg_latency;
          operator_delete(local_78.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>.
                          _M_impl.super__Vector_impl_data._M_start);
          dVar15 = local_58;
        }
        if (dVar15 <= 0.0) {
          local_58 = dVar15;
          main_cold_3();
          local_80 = 1;
          dVar15 = local_58;
        }
        if (dVar15 <= 0.0) break;
      }
      iVar3 = generic_getopt(argc,argv,"L:A:M:C",usage);
      bVar13 = iVar3 == -1;
    } while (!bVar13);
  }
  iVar3 = (int)local_80;
  if ((bVar13) && (iVar3 = 1, _optind == argc)) {
    load_config();
    openlog("ADLrt",0,8);
    handle_signals();
    iVar3 = audio_main();
  }
  return iVar3;
}

Assistant:

int main(int argc, char *argv[])
{
    i18n_setup();
    midi_db.init();

    char *home_dir = getenv("HOME");
    if (home_dir) {
        arg_config_file = std::string(home_dir) + "/.config/adlrt.conf";
    }

    for (int c; (c = generic_getopt(argc, argv, "L:A:M:C", usage)) != -1;) {
        switch (c) {
        case 'C' : {
            ::arg_config_file = optarg;
            break;
        }
        case 'L': {
            double latency = ::arg_latency = std::stod(optarg) * 1e-3;
            if (latency <= 0) {
                fprintf(stderr, "%s\n", _("Invalid latency."));
                return 1;
            }
            break;
        }
        case 'A': {
            RtAudio::Api audio_api = ::arg_audio_api = find_audio_api(optarg);
            if (!is_compiled_audio_api(audio_api)) {
                fprintf(stderr, _("Invalid audio system '%s'.\n"), optarg);
                return 1;
            }
            break;
        }
        case 'M': {
            RtMidi::Api midi_api = ::arg_midi_api = find_midi_api(optarg);
            if (!is_compiled_midi_api(midi_api)) {
                fprintf(stderr, _("Invalid MIDI system '%s'.\n"), optarg);
                return 1;
            }
            break;
        }
        default:
            usage();
            return 1;
        }
    }

    if (argc != optind)
        return 1;

    load_config();

#ifdef ADLJACK_GTK3
    gtk_init(&argc, &argv);
#endif

#if !defined(_WIN32)
    openlog("ADLrt", 0, LOG_USER);
#endif

    handle_signals();
    return audio_main();
}